

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_132a07::preprocessor<baryonyx::raw_problem>::is_unused_variable
          (preprocessor<baryonyx::raw_problem> *this,int variable)

{
  bool bVar1;
  reference pvVar2;
  reference piVar3;
  reference pvVar4;
  iterator iStack_78;
  int cst_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  iterator iStack_58;
  int cst_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  iterator iStack_38;
  int cst;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int variable_local;
  preprocessor<baryonyx::raw_problem> *this_local;
  
  pvVar2 = std::
           vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
           ::operator[](&this->cache,(long)variable);
  __end2 = std::vector<int,_std::allocator<int>_>::begin(&pvVar2->in_equal_constraints);
  iStack_38 = std::vector<int,_std::allocator<int>_>::end(&pvVar2->in_equal_constraints);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&__end2,&stack0xffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pvVar2 = std::
               vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
               ::operator[](&this->cache,(long)variable);
      __end2_1 = std::vector<int,_std::allocator<int>_>::begin(&pvVar2->in_greater_constraints);
      iStack_58 = std::vector<int,_std::allocator<int>_>::end(&pvVar2->in_greater_constraints);
      while( true ) {
        bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                          (&__end2_1,&stack0xffffffffffffffa8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          pvVar2 = std::
                   vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                   ::operator[](&this->cache,(long)variable);
          __end2_2 = std::vector<int,_std::allocator<int>_>::begin(&pvVar2->in_less_constraints);
          iStack_78 = std::vector<int,_std::allocator<int>_>::end(&pvVar2->in_less_constraints);
          while( true ) {
            bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                              (&__end2_2,&stack0xffffffffffffff88);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return true;
            }
            piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end2_2);
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->less_constraints,(long)*piVar3);
            if (0 < *pvVar4) break;
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end2_2);
          }
          return false;
        }
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end2_1);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->greater_constraints,(long)*piVar3);
        if (0 < *pvVar4) break;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2_1);
      }
      return false;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->equal_constraints,(long)*piVar3);
    if (0 < *pvVar4) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  return false;
}

Assistant:

bool is_unused_variable(int variable)
    {
        for (int cst : cache[variable].in_equal_constraints)
            if (equal_constraints[cst] > 0)
                return false;
        for (int cst : cache[variable].in_greater_constraints)
            if (greater_constraints[cst] > 0)
                return false;
        for (int cst : cache[variable].in_less_constraints)
            if (less_constraints[cst] > 0)
                return false;

        return true;
    }